

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

void __thiscall
google::protobuf::UninterpretedOption::set_identifier_value(UninterpretedOption *this,string *value)

{
  string *this_00;
  string *value_local;
  UninterpretedOption *this_local;
  
  set_has_identifier_value(this);
  if (this->identifier_value_ == (string *)internal::kEmptyString_abi_cxx11_) {
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)this_00);
    this->identifier_value_ = this_00;
  }
  std::__cxx11::string::assign((string *)this->identifier_value_);
  return;
}

Assistant:

inline void UninterpretedOption::set_identifier_value(const ::std::string& value) {
  set_has_identifier_value();
  if (identifier_value_ == &::google::protobuf::internal::kEmptyString) {
    identifier_value_ = new ::std::string;
  }
  identifier_value_->assign(value);
}